

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O3

void jpeg_idct_1x1(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  (*output_buf)[output_col] =
       cinfo->sample_range_limit
       [(ulong)((uint)*compptr->dct_table * (uint)(ushort)*coef_block + 4 >> 3 & 0x3ff) + 0x80];
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_1x1(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  int dcval;
  ISLOW_MULT_TYPE *quantptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  SHIFT_TEMPS

  /* We hardly need an inverse DCT routine for this: just take the
   * average pixel value, which is one-eighth of the DC coefficient.
   */
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  dcval = DEQUANTIZE(coef_block[0], quantptr[0]);
  dcval = (int)DESCALE((JLONG)dcval, 3);

  output_buf[0][output_col] = range_limit[dcval & RANGE_MASK];
}